

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void abgr_8888_to_abgr_f32
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ALLEGRO_COLOR *pAVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  ALLEGRO_COLOR *pAVar5;
  int iVar6;
  undefined4 *puVar7;
  ALLEGRO_COLOR AVar8;
  
  if (0 < height) {
    pAVar5 = (ALLEGRO_COLOR *)((long)dst + (long)(dy * dst_pitch) + (long)dx * 0x10);
    iVar4 = dst_pitch + 0xf;
    if (-1 < dst_pitch) {
      iVar4 = dst_pitch;
    }
    puVar7 = (undefined4 *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
    iVar3 = src_pitch + 3;
    if (-1 < src_pitch) {
      iVar3 = src_pitch;
    }
    iVar6 = 0;
    do {
      if (0 < width) {
        pAVar1 = pAVar5 + width;
        do {
          uVar2 = *puVar7;
          AVar8 = al_map_rgba((uchar)uVar2,(uchar)((uint)uVar2 >> 8),(uchar)((uint)uVar2 >> 0x10),
                              (uchar)((uint)uVar2 >> 0x18));
          *pAVar5 = AVar8;
          pAVar5 = pAVar5 + 1;
          puVar7 = puVar7 + 1;
        } while (pAVar5 < pAVar1);
      }
      pAVar5 = pAVar5 + ((iVar4 >> 4) - width);
      puVar7 = puVar7 + ((iVar3 >> 2) - width);
      iVar6 = iVar6 + 1;
    } while (iVar6 != height);
  }
  return;
}

Assistant:

static void abgr_8888_to_abgr_f32(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   ALLEGRO_COLOR *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 16 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      ALLEGRO_COLOR *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_ABGR_8888_TO_ABGR_F32(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}